

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionDeclarationNode *node)

{
  element_type *peVar1;
  FunctionDeclarationNode *pFVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  _List_node_base *p_Var5;
  PrintVisitor visitor;
  string local_70;
  FunctionDeclarationNode *local_50;
  undefined **local_48;
  ostream *local_40;
  int local_38;
  
  poVar3 = this->stream_;
  indent_abi_cxx11_(&local_70,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"FunctionDeclarationNode (");
  pmVar4 = std::__detail::
           _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&TypeNameStrings_abi_cxx11_,&node->returnType_);
  poVar3 = std::operator<<(poVar3,(string *)pmVar4);
  std::operator<<(poVar3,"):\n");
  std::__cxx11::string::~string((string *)&local_70);
  poVar3 = this->stream_;
  indent_abi_cxx11_(&local_70,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"Name: ");
  poVar3 = std::operator<<(poVar3,(string *)&node->name_);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_70);
  poVar3 = this->stream_;
  indent_abi_cxx11_(&local_70,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::operator<<(poVar3,"Arguments:\n");
  std::__cxx11::string::~string((string *)&local_70);
  p_Var5 = (_List_node_base *)&node->arguments_;
  local_50 = node;
  while (p_Var5 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                     *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)&node->arguments_) {
    poVar3 = this->stream_;
    indent_abi_cxx11_(&local_70,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)(p_Var5 + 1));
    poVar3 = std::operator<<(poVar3," (");
    pmVar4 = std::__detail::
             _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&TypeNameStrings_abi_cxx11_,(key_type *)(p_Var5 + 3));
    poVar3 = std::operator<<(poVar3,(string *)pmVar4);
    std::operator<<(poVar3,")\n");
    std::__cxx11::string::~string((string *)&local_70);
  }
  poVar3 = this->stream_;
  local_38 = this->indentation_ + 1;
  local_48 = &PTR__Visitor_00148d30;
  local_40 = poVar3;
  indent_abi_cxx11_(&local_70,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  pFVar2 = local_50;
  std::operator<<(poVar3,"Body:\n");
  std::__cxx11::string::~string((string *)&local_70);
  peVar1 = (pFVar2->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_StatementNode).super_Node._vptr_Node[2])(peVar1,&local_48);
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionDeclarationNode& node)
{
  stream_ << indent() << "FunctionDeclarationNode (" 
    << TypeNameStrings.at(node.getReturnType()) << "):\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  stream_ << indent() << "Arguments:\n";
  for(const auto& arg : node.getArguments())
  {
    stream_ << indent() << " " << arg.first 
      << " (" << TypeNameStrings.at(arg.second) << ")\n";
  }
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Body:\n";
  node.getBody()->accept(visitor);
}